

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O0

st__table * Abc_NtkRetimePrepareLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  st__table *table;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pNodeTo;
  int local_3c;
  int nOffSet;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pLatchOut;
  Abc_Obj_t *pLatchIn;
  Abc_Obj_t *pLatch;
  st__table *tLatches;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkBoxNum(pNtk);
  iVar2 = Abc_NtkLatchNum(pNtk);
  table = st__init_table(st__ptrcmp,st__ptrhash);
  for (local_3c = 0; iVar3 = Vec_PtrSize(pNtk->vBoxes), local_3c < iVar3; local_3c = local_3c + 1) {
    pAVar4 = Abc_NtkBox(pNtk,local_3c);
    iVar3 = Abc_ObjIsLatch(pAVar4);
    if (iVar3 != 0) {
      st__insert(table,(char *)pAVar4,(char *)(long)(local_3c - (iVar1 - iVar2)));
      pAVar5 = Abc_ObjFanin0(pAVar4);
      pNodeTo = Abc_ObjFanin0(pAVar5);
      Abc_ObjTransferFanout(pAVar5,pNodeTo);
      Abc_ObjDeleteFanin(pAVar5,pNodeTo);
      pAVar4 = Abc_ObjFanout0(pAVar4);
      pAVar5 = Abc_ObjFanin0(pAVar4);
      iVar3 = Abc_ObjFanoutNum(pAVar4);
      if (0 < iVar3) {
        Abc_ObjTransferFanout(pAVar4,pAVar5);
      }
      Abc_ObjDeleteFanin(pAVar4,pAVar5);
    }
  }
  return table;
}

Assistant:

st__table * Abc_NtkRetimePrepareLatches( Abc_Ntk_t * pNtk )
{
    st__table * tLatches;
    Abc_Obj_t * pLatch, * pLatchIn, * pLatchOut, * pFanin;
    int i, nOffSet = Abc_NtkBoxNum(pNtk) - Abc_NtkLatchNum(pNtk);
    // collect latches and remove CIs/COs
    tLatches = st__init_table( st__ptrcmp, st__ptrhash );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        // map latch into its true number
        st__insert( tLatches, (char *)(ABC_PTRUINT_T)pLatch, (char *)(ABC_PTRUINT_T)(i-nOffSet) );
        // disconnect LI     
        pLatchIn = Abc_ObjFanin0(pLatch);
        pFanin = Abc_ObjFanin0(pLatchIn);
        Abc_ObjTransferFanout( pLatchIn, pFanin );
        Abc_ObjDeleteFanin( pLatchIn, pFanin );
        // disconnect LO     
        pLatchOut = Abc_ObjFanout0(pLatch);
        pFanin = Abc_ObjFanin0(pLatchOut);
        if ( Abc_ObjFanoutNum(pLatchOut) > 0 )
            Abc_ObjTransferFanout( pLatchOut, pFanin );
        Abc_ObjDeleteFanin( pLatchOut, pFanin );
    }
    return tLatches;
}